

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

bool __thiscall
Imf_2_5::DwaCompressor::Classifier::match(Classifier *this,string *suffix,PixelType type)

{
  pointer pcVar1;
  size_t sVar2;
  long *plVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  bool bVar7;
  string tmp;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  if (this->_type != type) {
    return false;
  }
  if (this->_caseInsensitive != true) {
    sVar2 = suffix->_M_string_length;
    if (sVar2 != (this->_suffix)._M_string_length) {
      return false;
    }
    if (sVar2 == 0) {
      return true;
    }
    iVar4 = bcmp((suffix->_M_dataplus)._M_p,(this->_suffix)._M_dataplus._M_p,sVar2);
    return iVar4 == 0;
  }
  pcVar1 = (suffix->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + suffix->_M_string_length);
  sVar2 = local_40;
  plVar3 = local_48;
  if (local_40 == 0) {
    if ((this->_suffix)._M_string_length == 0) {
      bVar7 = true;
      plVar6 = local_48;
      goto LAB_00454cdf;
    }
  }
  else {
    sVar5 = 0;
    do {
      iVar4 = tolower((int)*(char *)((long)plVar3 + sVar5));
      plVar6 = local_48;
      *(char *)((long)plVar3 + sVar5) = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
    if (local_40 == (this->_suffix)._M_string_length) {
      if (local_40 == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(local_48,(this->_suffix)._M_dataplus._M_p,local_40);
        bVar7 = iVar4 == 0;
      }
      goto LAB_00454cdf;
    }
  }
  bVar7 = false;
  plVar6 = local_48;
LAB_00454cdf:
  if (plVar6 != local_38) {
    operator_delete(plVar6,local_38[0] + 1);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool match (const std::string &suffix, const PixelType type) const
    {
        if (_type != type) return false;

        if (_caseInsensitive) 
        {
            std::string tmp(suffix);
            std::transform(tmp.begin(), tmp.end(), tmp.begin(), tolower);
            return tmp == _suffix;
        }

        return suffix == _suffix;
    }